

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testMatchMain(diff_match_patch_test *this)

{
  int iVar1;
  diff_match_patch_test *pdVar2;
  allocator<wchar_t> local_6b;
  allocator<wchar_t> local_6a;
  allocator<wchar_t> local_69;
  wstring local_68 [32];
  wstring local_48 [32];
  wstring local_28;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_main: Equality.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdef",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_main((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_main: Null text.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdef",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_main((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_main: Null pattern.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_main((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,3,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_main: Exact match.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"de",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_main((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,3,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0x8 = 0x3f333333;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_main: Complex match.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_48,L"I am the very model of a modern major general.",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L" that berry ",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_main((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,4,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  return;
}

Assistant:

void diff_match_patch_test::testMatchMain() {
  // Full match.
  assertEquals(L"match_main: Equality.", 0, dmp.match_main(L"abcdef", L"abcdef", 1000));

  assertEquals(L"match_main: Null text.", -1, dmp.match_main(L"", L"abcdef", 1));

  assertEquals(L"match_main: Null pattern.", 3, dmp.match_main(L"abcdef", L"", 3));

  assertEquals(L"match_main: Exact match.", 3, dmp.match_main(L"abcdef", L"de", 3));

  dmp.Match_Threshold = 0.7f;
  assertEquals(L"match_main: Complex match.", 4, dmp.match_main(L"I am the very model of a modern major general.", L" that berry ", 5));
  dmp.Match_Threshold = 0.5f;
}